

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

CallbackResult __thiscall StringBTree::traverseCallback(StringBTree *this,uint8_t *data)

{
  uint8_t *puVar1;
  ostream *poVar2;
  KeyType obj;
  string str;
  
  obj.m_value = (char *)0x0;
  obj.m_length = 0;
  puVar1 = parseData(this,&obj,data);
  if (puVar1 == (uint8_t *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot parse String object.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&str,obj.m_value,obj.m_value + obj.m_length);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&str);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&str);
  }
  return CONTINUE;
}

Assistant:

StringBTree::CallbackResult StringBTree::traverseCallback(const uint8_t* data) const
{
	CallbackResult result = CallbackResult::CONTINUE;

	KeyType obj;
	if (parseData(obj, data)) {
		std::string str(obj.value(), obj.length());
		std::cout << str << std::endl;
	} else {
		std::cerr << "Cannot parse String object." << std::endl;
	}

	return result;
}